

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
Ser<AutoFile,std::vector<double,std::allocator<double>>>
          (VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *this,AutoFile *s,
          vector<double,_std::allocator<double>_> *v)

{
  FILE *pFVar1;
  size_t in_RCX;
  value_type_conflict7 *elem;
  FILE *pFVar2;
  long in_FS_OFFSET;
  uint64_t local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>
            ((AutoFile *)this,
             (long)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)s->m_file >> 3);
  pFVar2 = s->m_file;
  pFVar1 = (FILE *)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (pFVar2 != pFVar1) {
    do {
      local_30 = EncodeDouble(*(double *)pFVar2);
      AutoFile::write((AutoFile *)this,(int)&local_30,&DAT_00000008,in_RCX);
      pFVar2 = (FILE *)&pFVar2->_IO_read_ptr;
    } while (pFVar2 != pFVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }